

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnndelem * trydelem(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *pxVar1;
  rnndb *prVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  rnndelem *prVar7;
  xmlNode *pxVar8;
  long lVar9;
  rnndelem *prVar10;
  uint64_t uVar11;
  char *pcVar12;
  xmlNode *node_00;
  xmlNode *node_01;
  rnnetype rVar13;
  _xmlAttr *attr;
  _xmlNode *node_02;
  xmlAttr *pxVar14;
  bool bVar15;
  
  pxVar1 = node->name;
  iVar4 = strcmp((char *)pxVar1,"use-group");
  if (iVar4 == 0) {
    prVar10 = (rnndelem *)calloc(0x110,1);
    prVar10->file = file;
    prVar10->type = RNN_ETYPE_USE_GROUP;
    attr = node->properties;
    if (attr != (_xmlAttr *)0x0) {
      pcVar12 = (char *)0x0;
      do {
        pxVar1 = attr->name;
        iVar4 = strcmp((char *)pxVar1,"name");
        if (iVar4 == 0) {
          pcVar12 = getattrib(db,file,(uint)node->line,attr);
          pcVar12 = strdup(pcVar12);
          prVar10->name = pcVar12;
        }
        else {
          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,pxVar1,
                  node->name);
          db->estatus = 1;
        }
        attr = attr->next;
      } while (attr != (_xmlAttr *)0x0);
      if (pcVar12 != (char *)0x0) {
        return prVar10;
      }
    }
    fprintf(_stderr,"%s:%d: nameless use-group\n",file,(ulong)node->line);
    free(prVar10);
    goto LAB_00106cd4;
  }
  iVar4 = strcmp((char *)pxVar1,"stripe");
  pxVar8 = node;
  if (iVar4 == 0) {
    rVar13 = RNN_ETYPE_STRIPE;
LAB_001065f5:
    prVar10 = (rnndelem *)calloc(0x110,1);
    prVar10->type = rVar13;
    prVar10->length = 1;
    prVar10->file = file;
    for (pxVar14 = node->properties; pxVar14 != (xmlAttr *)0x0; pxVar14 = pxVar14->next) {
      pxVar1 = pxVar14->name;
      iVar5 = strcmp((char *)pxVar1,"name");
      if (iVar5 == 0) {
        pcVar12 = getattrib(db,file,(uint)node->line,pxVar14);
        pcVar12 = strdup(pcVar12);
        prVar10->name = pcVar12;
      }
      else {
        iVar5 = strcmp((char *)pxVar1,"offset");
        if (iVar5 == 0) {
          uVar11 = getnumattrib(db,file,(uint)node->line,pxVar14);
          prVar10->offset = uVar11;
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"length");
          if (iVar5 == 0) {
            uVar11 = getnumattrib(db,file,(uint)node->line,pxVar14);
            prVar10->length = uVar11;
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"stride");
            if (iVar5 == 0) {
              uVar11 = getnumattrib(db,file,(uint)node->line,pxVar14);
              prVar10->stride = uVar11;
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"prefix");
              if (iVar5 == 0) {
                pcVar12 = getattrib(db,file,(uint)node->line,pxVar14);
                pcVar12 = strdup(pcVar12);
                (prVar10->varinfo).prefixstr = pcVar12;
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"varset");
                if (iVar5 == 0) {
                  pcVar12 = getattrib(db,file,(uint)node->line,pxVar14);
                  pcVar12 = strdup(pcVar12);
                  (prVar10->varinfo).varsetstr = pcVar12;
                }
                else {
                  iVar5 = strcmp((char *)pxVar1,"variants");
                  if (iVar5 == 0) {
                    pcVar12 = getattrib(db,file,(uint)node->line,pxVar14);
                    pcVar12 = strdup(pcVar12);
                    (prVar10->varinfo).variantsstr = pcVar12;
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,
                            pxVar1,node->name);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
    node_02 = node->children;
    if (node_02 != (_xmlNode *)0x0) {
      pxVar8 = (xmlNode *)0x0;
      iVar3 = 0;
      iVar5 = 0;
      do {
        if (node_02->type == XML_ELEMENT_NODE) {
          prVar7 = trydelem(db,file,node_02);
          if (prVar7 == (rnndelem *)0x0) {
            pcVar12 = file;
            iVar6 = trytop(db,file,node_02);
            if (iVar6 == 0) {
              prVar2 = (rnndb *)node_02->name;
              iVar6 = trydoc(prVar2,pcVar12,node_00);
              if (iVar6 == 0) {
                fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)node_02->line,
                        node->name,prVar2);
                db->estatus = 1;
              }
            }
          }
          else {
            if (iVar3 <= iVar5) {
              bVar15 = iVar3 == 0;
              iVar3 = iVar3 * 2;
              if (bVar15) {
                iVar3 = 0x10;
              }
              prVar10->subelemsmax = iVar3;
              pxVar8 = (xmlNode *)realloc(pxVar8,(long)iVar3 << 3);
              prVar10->subelems = (rnndelem **)pxVar8;
            }
            lVar9 = (long)iVar5;
            iVar5 = iVar5 + 1;
            prVar10->subelemsnum = iVar5;
            (&pxVar8->_private)[lVar9] = prVar7;
          }
        }
        node_02 = node_02->next;
      } while (node_02 != (_xmlNode *)0x0);
    }
    if (iVar4 == 0) {
      return prVar10;
    }
    if (prVar10->stride != 0) {
      return prVar10;
    }
    trydelem_cold_1();
LAB_0010694b:
    iVar4 = 8;
  }
  else {
    iVar5 = strcmp((char *)pxVar1,"array");
    if (iVar5 == 0) {
      rVar13 = RNN_ETYPE_ARRAY;
      goto LAB_001065f5;
    }
    iVar4 = strcmp((char *)pxVar1,"reg8");
    if (iVar4 == 0) goto LAB_0010694b;
    iVar4 = strcmp((char *)pxVar1,"reg16");
    if (iVar4 == 0) {
      iVar4 = 0x10;
    }
    else {
      iVar4 = strcmp((char *)pxVar1,"reg32");
      if (iVar4 == 0) {
        iVar4 = 0x20;
      }
      else {
        iVar4 = strcmp((char *)pxVar1,"reg64");
        if (iVar4 != 0) {
          return (rnndelem *)0x0;
        }
        iVar4 = 0x40;
      }
    }
  }
  prVar10 = (rnndelem *)calloc(0x110,1);
  prVar10->file = file;
  prVar10->width = iVar4;
  prVar10->length = 1;
  prVar10->access = RNN_ACCESS_RW;
  pxVar14 = pxVar8->properties;
  if (pxVar14 != (xmlAttr *)0x0) {
    do {
      pxVar1 = pxVar14->name;
      iVar4 = strcmp((char *)pxVar1,"name");
      if (iVar4 == 0) {
        pcVar12 = getattrib(db,file,(uint)pxVar8->line,pxVar14);
        pcVar12 = strdup(pcVar12);
        prVar10->name = pcVar12;
      }
      else {
        iVar4 = strcmp((char *)pxVar1,"offset");
        if (iVar4 == 0) {
          uVar11 = getnumattrib(db,file,(uint)pxVar8->line,pxVar14);
          prVar10->offset = uVar11;
        }
        else {
          iVar4 = strcmp((char *)pxVar1,"length");
          if (iVar4 == 0) {
            uVar11 = getnumattrib(db,file,(uint)pxVar8->line,pxVar14);
            prVar10->length = uVar11;
          }
          else {
            iVar4 = strcmp((char *)pxVar1,"stride");
            if (iVar4 == 0) {
              uVar11 = getnumattrib(db,file,(uint)pxVar8->line,pxVar14);
              prVar10->stride = uVar11;
            }
            else {
              iVar4 = strcmp((char *)pxVar1,"varset");
              if (iVar4 == 0) {
                pcVar12 = getattrib(db,file,(uint)pxVar8->line,pxVar14);
                pcVar12 = strdup(pcVar12);
                (prVar10->varinfo).varsetstr = pcVar12;
              }
              else {
                iVar4 = strcmp((char *)pxVar1,"variants");
                if (iVar4 == 0) {
                  pcVar12 = getattrib(db,file,(uint)pxVar8->line,pxVar14);
                  pcVar12 = strdup(pcVar12);
                  (prVar10->varinfo).variantsstr = pcVar12;
                }
                else {
                  iVar4 = strcmp((char *)pxVar1,"access");
                  if (iVar4 == 0) {
                    pcVar12 = getattrib(db,file,(uint)pxVar8->line,pxVar14);
                    if (*pcVar12 == 'w') {
                      if (pcVar12[1] != '\0') goto LAB_00106be2;
                      prVar10->access = RNN_ACCESS_W;
                    }
                    else if (*pcVar12 == 'r') {
                      if (pcVar12[1] == '\0') {
                        prVar10->access = RNN_ACCESS_R;
                      }
                      else {
                        if ((pcVar12[1] != 'w') || (pcVar12[2] != '\0')) goto LAB_00106be2;
                        prVar10->access = RNN_ACCESS_RW;
                      }
                    }
                    else {
LAB_00106be2:
                      fprintf(_stderr,"%s:%d: wrong access type \"%s\" for register\n",file,
                              (ulong)pxVar8->line,pcVar12);
                    }
                  }
                  else {
                    iVar4 = trytypeattr(db,file,pxVar8,pxVar14,&prVar10->typeinfo);
                    if (iVar4 == 0) {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for register\n",file,
                              (ulong)pxVar8->line,pxVar14->name);
                      db->estatus = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
      pxVar14 = pxVar14->next;
    } while (pxVar14 != (_xmlAttr *)0x0);
  }
  pxVar8 = pxVar8->children;
  if (pxVar8 != (xmlNode *)0x0) {
    do {
      if (((pxVar8->type == XML_ELEMENT_NODE) &&
          (iVar4 = trytypetag(db,file,pxVar8,&prVar10->typeinfo), iVar4 == 0)) &&
         (pcVar12 = file, iVar4 = trytop(db,file,pxVar8), iVar4 == 0)) {
        prVar2 = (rnndb *)pxVar8->name;
        iVar4 = trydoc(prVar2,pcVar12,node_01);
        if (iVar4 == 0) {
          fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)pxVar8->line,node->name,
                  prVar2);
          db->estatus = 1;
        }
      }
      pxVar8 = pxVar8->next;
    } while (pxVar8 != (_xmlNode *)0x0);
  }
  if (prVar10->name != (char *)0x0) {
    return prVar10;
  }
  fprintf(_stderr,"%s:%d: nameless register\n",file,(ulong)node->line);
LAB_00106cd4:
  db->estatus = 1;
  return (rnndelem *)0x0;
}

Assistant:

static struct rnndelem *trydelem(struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "use-group")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->file = file;
		res->type = RNN_ETYPE_USE_GROUP;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!res->name) {
			fprintf (stderr, "%s:%d: nameless use-group\n", file, node->line);
			free(res);
			db->estatus = 1;
			return 0;
		}
		return res;
	} else if (!strcmp(node->name, "stripe") || !strcmp(node->name, "array")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->type = (strcmp(node->name, "stripe")?RNN_ETYPE_ARRAY:RNN_ETYPE_STRIPE);
		res->length = 1;
		res->file = file;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "offset")) {
				res->offset = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "length")) {
				res->length = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "stride")) {
				res->stride = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "prefix")) {
				res->varinfo.prefixstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "varset")) {
				res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "variants")) {
				res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		xmlNode *chain = node->children;
		while (chain) {
			struct rnndelem *delem;
			if (chain->type != XML_ELEMENT_NODE) {
			} else if ((delem = trydelem(db, file, chain))) {
				ADDARRAY(res->subelems, delem);
			} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
				fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
				db->estatus = 1;
			}
			chain = chain->next;
		}

		/* Sanity checking */
		if (res->type == RNN_ETYPE_ARRAY && res->stride == 0) {
			fprintf(stderr, "%s: Array %s's stride is undefined. Aborting.\n", file, res->name);
			exit(-1);
		}
		return res;

	}
	int width;
	if (!strcmp(node->name, "reg8"))
		width = 8;
	else if (!strcmp(node->name, "reg16"))
		width = 16;
	else if (!strcmp(node->name, "reg32"))
		width = 32;
	else if (!strcmp(node->name, "reg64"))
		width = 64;
	else
		return 0;
	struct rnndelem *res = calloc(sizeof *res, 1);
	res->file = file;
	res->type = RNN_ETYPE_REG;
	res->width = width;
	res->length = 1;
	res->access = RNN_ACCESS_RW;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "offset")) {
			res->offset = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "length")) {
			res->length = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "stride")) {
			res->stride = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "varset")) {
			res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "access")) {
			char *str = getattrib(db, file, node->line, attr);
			if (!strcmp(str, "r"))
				res->access = RNN_ACCESS_R;
			else if (!strcmp(str, "w"))
				res->access = RNN_ACCESS_W;
			else if (!strcmp(str, "rw"))
				res->access = RNN_ACCESS_RW;
			else
				fprintf (stderr, "%s:%d: wrong access type \"%s\" for register\n", file, node->line, str);
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for register\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless register\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
	}
	return res;
}